

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::setTextBackgroundColor(QTextEdit *this,QColor *c)

{
  long in_FS_OFFSET;
  QBrush local_40 [8];
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_38);
  QBrush::QBrush(local_40,(QColor *)c,SolidPattern);
  QTextFormat::setBackground((QTextFormat *)&local_38,local_40);
  QBrush::~QBrush(local_40);
  mergeCurrentCharFormat(this,(QTextCharFormat *)&local_38);
  QTextFormat::~QTextFormat((QTextFormat *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setTextBackgroundColor(const QColor &c)
{
    QTextCharFormat fmt;
    fmt.setBackground(QBrush(c));
    mergeCurrentCharFormat(fmt);
}